

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O0

WORD32 ihevcd_sev(bitstrm_t *ps_bitstrm)

{
  uint uVar1;
  uint *puVar2;
  UWORD32 UVar3;
  long in_RDI;
  UWORD32 pu4_word_tmp;
  UWORD32 temp;
  UWORD32 u4_abs_val;
  UWORD32 u4_clz;
  UWORD32 u4_bits_read;
  uint local_2c;
  uint local_28;
  uint local_14;
  uint local_4;
  
  if (0x20U - *(int *)(in_RDI + 8) < 0x20) {
    local_28 = *(uint *)(in_RDI + 0x1c) >> (0x20U - (char)*(undefined4 *)(in_RDI + 8) & 0x1f);
  }
  else {
    local_28 = 0;
  }
  UVar3 = CLZ(local_28 | *(int *)(in_RDI + 0x18) << ((byte)*(undefined4 *)(in_RDI + 8) & 0x1f));
  *(UWORD32 *)(in_RDI + 8) = UVar3 + 1 + *(int *)(in_RDI + 8);
  if (0x1f < *(uint *)(in_RDI + 8)) {
    *(undefined4 *)(in_RDI + 0x18) = *(undefined4 *)(in_RDI + 0x1c);
    puVar2 = *(uint **)(in_RDI + 0x10);
    *(uint **)(in_RDI + 0x10) = puVar2 + 1;
    uVar1 = *puVar2;
    *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + -0x20;
    *(uint *)(in_RDI + 0x1c) =
         uVar1 << 0x18 | (uVar1 & 0xff00) << 8 | (uVar1 & 0xff0000) >> 8 | uVar1 >> 0x18;
  }
  local_14 = 0;
  if (UVar3 != 0) {
    local_14 = (uint)(*(int *)(in_RDI + 0x18) << ((byte)*(undefined4 *)(in_RDI + 8) & 0x1f)) >>
               (0x20 - (byte)UVar3 & 0x1f);
    *(UWORD32 *)(in_RDI + 8) = UVar3 + *(int *)(in_RDI + 8);
    if (0x20 < *(uint *)(in_RDI + 8)) {
      if (0x40U - *(int *)(in_RDI + 8) < 0x20) {
        local_2c = *(uint *)(in_RDI + 0x1c) >> (0x40U - (char)*(undefined4 *)(in_RDI + 8) & 0x1f);
      }
      else {
        local_2c = 0;
      }
      local_14 = local_2c | local_14;
    }
    if (0x1f < *(uint *)(in_RDI + 8)) {
      *(undefined4 *)(in_RDI + 0x18) = *(undefined4 *)(in_RDI + 0x1c);
      puVar2 = *(uint **)(in_RDI + 0x10);
      *(uint **)(in_RDI + 0x10) = puVar2 + 1;
      uVar1 = *puVar2;
      *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + -0x20;
      *(uint *)(in_RDI + 0x1c) =
           uVar1 << 0x18 | (uVar1 & 0xff00) << 8 | (uVar1 & 0xff0000) >> 8 | uVar1 >> 0x18;
    }
  }
  local_4 = (1 << ((byte)UVar3 & 0x1f)) + local_14 >> 1;
  if ((local_14 & 1) != 0) {
    local_4 = -local_4;
  }
  return local_4;
}

Assistant:

WORD32 ihevcd_sev(bitstrm_t *ps_bitstrm)
{
    UWORD32 u4_bits_read;
    UWORD32 u4_clz;
    UWORD32 u4_abs_val;


    /***************************************************************/
    /* Find leading zeros in next 32 bits                          */
    /***************************************************************/
    BITS_NXT32(u4_bits_read,
               ps_bitstrm->pu4_buf,
               ps_bitstrm->u4_bit_ofst,
               ps_bitstrm->u4_cur_word,
               ps_bitstrm->u4_nxt_word);


    u4_clz = CLZ(u4_bits_read);

    BITS_FLUSH(ps_bitstrm->pu4_buf,
               ps_bitstrm->u4_bit_ofst,
               ps_bitstrm->u4_cur_word,
               ps_bitstrm->u4_nxt_word,
               (u4_clz + 1));

    u4_bits_read = 0;
    if(u4_clz)
    {
        BITS_GET(u4_bits_read,
                 ps_bitstrm->pu4_buf,
                 ps_bitstrm->u4_bit_ofst,
                 ps_bitstrm->u4_cur_word,
                 ps_bitstrm->u4_nxt_word,
                 u4_clz);
    }
    u4_abs_val = ((1 << u4_clz) + u4_bits_read) >> 1;
    if(u4_bits_read & 0x1)
        return (-(WORD32)u4_abs_val);
    else
        return (u4_abs_val);
}